

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  char *__s;
  ulong in_RSI;
  size_type in_RDI;
  precise_unit pVar2;
  size_t fnd;
  precise_unit retunit;
  uint64_t in_stack_00000e68;
  string *in_stack_00000e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *__n1;
  _Alloc_hider in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_49 [33];
  char *local_28;
  precise_unit *local_10;
  undefined8 local_8;
  
  if ((in_RSI & 0x200000) == 0) {
    __n1 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (allocator<char> *)in_stack_ffffffffffffff80._M_p);
    __s = (char *)findWordOperatorSep(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator(local_49);
    if (__s != (char *)0xffffffffffffffff) {
      local_28 = __s;
      if (__s == (char *)0x0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff80._M_p,in_RDI,(size_type)__n1,(char *)0x0);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff80._M_p,in_RDI,(size_type)__n1,__s);
      }
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff80;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      pVar2 = unit_from_string_internal(in_stack_00000e70,in_stack_00000e68);
      local_8 = pVar2._8_8_;
      pVar2.multiplier_ = (precise_unit *)pVar2.multiplier_;
      local_10 = pVar2.multiplier_;
      std::__cxx11::string::~string(this);
      bVar1 = is_error(pVar2.multiplier_);
      if (!bVar1) goto LAB_0078bb60;
    }
  }
  local_10 = (precise_unit *)0x7ff4000000000000;
  local_8 = 0xfa94a488;
LAB_0078bb60:
  pVar2.base_units_ = (unit_data)(undefined4)local_8;
  pVar2.commodity_ = local_8._4_4_;
  pVar2.multiplier_ = (double)local_10;
  return pVar2;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}